

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O2

int jpc_ft_analyze(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  jpc_fix_t *pjVar4;
  ulong uVar5;
  jpc_fix_t *pjVar6;
  long *plVar7;
  jpc_fix_t *pjVar8;
  uint uVar9;
  jpc_fix_t *pjVar10;
  uint parity;
  jpc_fix_t *pjVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  jpc_fix_t *local_a0;
  jpc_fix_t *local_98;
  jpc_fix_t *local_90;
  jpc_fix_t *local_48;
  
  parity = ystart & 1;
  uVar16 = (height - parity) + 1 >> 1;
  uVar18 = (ulong)(uVar16 * stride);
  uVar2 = height & 1;
  uVar9 = (uint)(uVar2 != parity);
  uVar14 = (uint)(uVar2 == parity);
  iVar12 = ((height - parity) - uVar16) - uVar14;
  iVar17 = (uVar16 - (parity == 0)) - uVar9;
  uVar5 = (ulong)((((byte)((char)ystart + 1) & 1) + height >> 1) * stride);
  local_a0 = a + uVar5;
  local_90 = a + (uint)stride + uVar5;
  pjVar8 = a + (uint)stride + uVar18;
  local_98 = a + (uint)stride;
  local_48 = a + uVar18;
  pjVar11 = a;
  for (uVar16 = 0; uVar16 < (width & 0xfffffff0U); uVar16 = uVar16 + 0x10) {
    jpc_qmfb_split_colgrp(pjVar11,height,stride,parity);
    if ((uint)height < 2) {
      if (parity != 0) {
        for (lVar15 = 0; (int)lVar15 != 0x10; lVar15 = lVar15 + 1) {
          pjVar11[lVar15] = (long)((int)pjVar11[lVar15] * 2);
        }
      }
    }
    else {
      pjVar4 = pjVar11 + uVar18;
      pjVar6 = pjVar11;
      pjVar10 = local_98;
      iVar13 = iVar12;
      if (parity != 0) {
        for (lVar15 = 0; (int)lVar15 != 0x10; lVar15 = lVar15 + 1) {
          pjVar11[uVar18 + lVar15] = pjVar11[uVar18 + lVar15] - pjVar11[lVar15];
        }
        pjVar4 = pjVar4 + (uint)stride;
      }
      while (iVar13 != 0) {
        for (lVar15 = 0; (int)lVar15 != 0x10; lVar15 = lVar15 + 1) {
          pjVar4[lVar15] =
               pjVar4[lVar15] - (long)(int)((ulong)(pjVar10[lVar15] + pjVar6[lVar15]) >> 1);
        }
        pjVar4 = pjVar4 + (uint)stride;
        pjVar6 = pjVar6 + (uint)stride;
        pjVar10 = pjVar10 + (uint)stride;
        iVar13 = iVar13 + -1;
      }
      if (uVar2 == parity) {
        for (lVar15 = 0; (int)lVar15 != 0x10; lVar15 = lVar15 + 1) {
          pjVar4[lVar15] = pjVar4[lVar15] - pjVar6[lVar15];
        }
      }
      pjVar4 = pjVar11;
      pjVar6 = local_48;
      pjVar10 = pjVar8;
      iVar13 = iVar17;
      if (parity == 0) {
        for (lVar15 = 0; (int)lVar15 != 0x10; lVar15 = lVar15 + 1) {
          pjVar11[lVar15] =
               pjVar11[lVar15] + (pjVar11[uVar18 + lVar15] * 0x80000000 + 0x80000000 >> 0x20);
        }
        pjVar4 = pjVar11 + (uint)stride;
      }
      while (iVar13 != 0) {
        for (lVar15 = 0; (int)lVar15 != 0x10; lVar15 = lVar15 + 1) {
          pjVar4[lVar15] =
               pjVar4[lVar15] +
               ((pjVar10[lVar15] + pjVar6[lVar15]) * 0x40000000 + 0x80000000 >> 0x20);
        }
        pjVar4 = pjVar4 + (uint)stride;
        pjVar6 = pjVar6 + (uint)stride;
        pjVar10 = pjVar10 + (uint)stride;
        iVar13 = iVar13 + -1;
      }
      if (uVar2 != parity) {
        for (lVar15 = 0; (int)lVar15 != 0x10; lVar15 = lVar15 + 1) {
          pjVar4[lVar15] = pjVar4[lVar15] + (pjVar6[lVar15] * 0x80000000 + 0x80000000 >> 0x20);
        }
      }
    }
    pjVar11 = pjVar11 + 0x10;
    local_a0 = local_a0 + 0x10;
    local_90 = local_90 + 0x10;
    local_98 = local_98 + 0x10;
    pjVar8 = pjVar8 + 0x10;
    local_48 = local_48 + 0x10;
  }
  if ((width & 0xfffffff0U) != width) {
    uVar16 = width & 0xf;
    jpc_qmfb_split_colres(pjVar11,height,uVar16,stride,parity);
    if ((uint)height < 2) {
      if (parity != 0) {
        for (lVar15 = 0; uVar16 != (uint)lVar15; lVar15 = lVar15 + 1) {
          pjVar11[lVar15] = (long)((int)pjVar11[lVar15] * 2);
        }
      }
    }
    else {
      uVar3 = (parity ^ 1) + height >> 1;
      pjVar8 = pjVar11 + uVar3 * stride;
      if (parity != 0) {
        for (lVar15 = 0; uVar16 != (uint)lVar15; lVar15 = lVar15 + 1) {
          pjVar11[uVar5 + lVar15] = pjVar11[uVar5 + lVar15] - pjVar11[lVar15];
        }
        pjVar8 = pjVar8 + (uint)stride;
      }
      iVar12 = ((height - parity) - uVar3) - uVar14;
      pjVar4 = pjVar11;
      while (bVar19 = iVar12 != 0, iVar12 = iVar12 + -1, bVar19) {
        for (lVar15 = 0; uVar16 != (uint)lVar15; lVar15 = lVar15 + 1) {
          pjVar8[lVar15] =
               pjVar8[lVar15] - (long)(int)((ulong)(local_98[lVar15] + pjVar4[lVar15]) >> 1);
        }
        pjVar4 = pjVar4 + (uint)stride;
        pjVar8 = pjVar8 + (uint)stride;
        local_98 = local_98 + (uint)stride;
      }
      if (uVar2 == parity) {
        for (lVar15 = 0; uVar16 != (uint)lVar15; lVar15 = lVar15 + 1) {
          pjVar8[lVar15] = pjVar8[lVar15] - pjVar4[lVar15];
        }
      }
      if (parity == 0) {
        for (lVar15 = 0; uVar16 != (uint)lVar15; lVar15 = lVar15 + 1) {
          pjVar11[lVar15] =
               pjVar11[lVar15] + (pjVar11[uVar5 + lVar15] * 0x80000000 + 0x80000000 >> 0x20);
        }
        pjVar11 = pjVar11 + (uint)stride;
      }
      iVar12 = (uVar3 - (parity == 0)) - uVar9;
      while (bVar19 = iVar12 != 0, iVar12 = iVar12 + -1, bVar19) {
        for (lVar15 = 0; uVar16 != (uint)lVar15; lVar15 = lVar15 + 1) {
          pjVar11[lVar15] =
               pjVar11[lVar15] +
               ((local_90[lVar15] + local_a0[lVar15]) * 0x40000000 + 0x80000000 >> 0x20);
        }
        pjVar11 = pjVar11 + (uint)stride;
        local_a0 = local_a0 + (uint)stride;
        local_90 = local_90 + (uint)stride;
      }
      if (uVar2 != parity) {
        for (lVar15 = 0; uVar16 != (uint)lVar15; lVar15 = lVar15 + 1) {
          pjVar11[lVar15] = pjVar11[lVar15] + (local_a0[lVar15] * 0x80000000 + 0x80000000 >> 0x20);
        }
      }
    }
  }
  uVar2 = xstart & 1;
  uVar9 = (uVar2 ^ 1) + width >> 1;
  local_90._0_4_ = width & 1;
  bVar19 = (width & 1U) == uVar2;
  pjVar11 = a + uVar9;
  for (iVar12 = 0; iVar12 != height; iVar12 = iVar12 + 1) {
    jpc_qmfb_split_row(a,width,uVar2);
    if ((uint)width < 2) {
      if (uVar2 != 0) {
        *a = (long)((int)*a * 2);
      }
    }
    else {
      plVar1 = a + uVar9;
      plVar7 = plVar1;
      if (uVar2 != 0) {
        *plVar1 = *plVar1 - *a;
        plVar7 = plVar1 + 1;
      }
      for (lVar15 = 0; ((width - (uint)bVar19) - uVar9) - uVar2 != (int)lVar15; lVar15 = lVar15 + 1)
      {
        plVar7[lVar15] = plVar7[lVar15] - (long)(int)((ulong)(a[lVar15 + 1] + a[lVar15]) >> 1);
      }
      if ((uint)local_90 == uVar2) {
        plVar7[lVar15] = plVar7[lVar15] - a[lVar15];
      }
      pjVar8 = a;
      if (uVar2 == 0) {
        *a = *a + (*plVar1 * 0x80000000 + 0x80000000 >> 0x20);
        pjVar8 = a + 1;
      }
      for (lVar15 = 0; (!bVar19 - uVar9) + (uint)(uVar2 == 0) + (int)lVar15 != 0;
          lVar15 = lVar15 + 1) {
        pjVar8[lVar15] =
             pjVar8[lVar15] +
             ((pjVar11[lVar15 + 1] + pjVar11[lVar15]) * 0x40000000 + 0x80000000 >> 0x20);
      }
      if ((uint)local_90 != uVar2) {
        pjVar8[lVar15] = pjVar8[lVar15] + (pjVar11[lVar15] * 0x80000000 + 0x80000000 >> 0x20);
      }
    }
    a = a + stride;
    pjVar11 = pjVar11 + stride;
  }
  return 0;
}

Assistant:

int jpc_ft_analyze(jpc_fix_t *a, int xstart, int ystart, int width, int height,
  int stride)
{
	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;
	jpc_fix_t *startptr;

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_qmfb_split_colgrp(startptr, numrows, stride, rowparity);
		jpc_ft_fwdlift_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_qmfb_split_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_ft_fwdlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_qmfb_split_row(startptr, numcols, colparity);
		jpc_ft_fwdlift_row(startptr, numcols, colparity);
		startptr += stride;
	}

	return 0;

}